

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMP_Next.cpp
# Opt level: O2

void get_next(string *t)

{
  pointer pcVar1;
  long lVar2;
  ostream *this;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  int k;
  ulong uVar6;
  
  memset(nexta,0x3f,0x194);
  nexta[1] = 0;
  uVar6 = t->_M_string_length;
  iVar3 = 0;
  uVar4 = 1;
  while (uVar4 < uVar6) {
    if ((iVar3 == 0) || (pcVar1 = (t->_M_dataplus)._M_p, pcVar1[uVar4] == pcVar1[iVar3])) {
      iVar3 = iVar3 + 1;
      nexta[uVar4 + 1] = iVar3;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    else {
      iVar3 = nexta[iVar3];
    }
  }
  for (uVar6 = 1; uVar6 < uVar4; uVar6 = uVar6 + 1) {
    pcVar5 = " ";
    if (uVar6 == 1) {
      pcVar5 = "   next:";
    }
    this = std::operator<<((ostream *)&std::cout,pcVar5);
    lVar2 = *(long *)this;
    *(uint *)(this + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(this + *(long *)(lVar2 + -0x18) + 0x18) | 0x80;
    *(undefined8 *)(this + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    std::ostream::operator<<(this,nexta[uVar6]);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void get_next(string t) {
    ms(nexta,INF);
    int i = 1, j = 0;
    nexta[1] = 0;
    while(i < t.length()) {
        if(j==0 || t[i]==t[j]) {
            ++i; ++j;
            nexta[i] = j;
        }
        else j = nexta[j];
    }
    for(int k = 1; k < i; k++) {
        cout << (k==1?"   next:":" ") << setiosflags(ios::right) << setw(2) << nexta[k];
    }
    cout << endl;
}